

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retLvalue.c
# Opt level: O3

int Abc_NtkRetimeLValue(Abc_Ntk_t *pNtk,int nIterLimit,int fVerbose)

{
  int iVar1;
  void *pvVar2;
  uint Fi;
  int iVar3;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vLatches;
  void **ppvVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  timespec ts;
  timespec local_40;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic( pNtk )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                  ,0x41,"int Abc_NtkRetimeLValue(Abc_Ntk_t *, int, int)");
  }
  iVar1 = pNtk->nObjCounts[8];
  Fi = Abc_NtkLevel(pNtk);
  ppvVar4 = (void **)0x0;
  vNodes = Abc_NtkDfs(pNtk,0);
  iVar3 = pNtk->nObjCounts[8];
  vLatches = (Vec_Ptr_t *)malloc(0x10);
  iVar12 = 8;
  if (6 < iVar3 - 1U) {
    iVar12 = iVar3;
  }
  vLatches->nSize = 0;
  vLatches->nCap = iVar12;
  if (iVar12 != 0) {
    ppvVar4 = (void **)malloc((long)iVar12 << 3);
  }
  vLatches->pArray = ppvVar4;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar12 = pNtk->vObjs->nSize;
    uVar11 = (long)iVar12 + 500;
    iVar8 = (int)uVar11;
    if ((pNtk->vTravIds).nCap < iVar8) {
      piVar5 = (int *)malloc(uVar11 * 4);
      (pNtk->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar8;
    }
    else {
      piVar5 = (int *)0x0;
    }
    if (-500 < iVar12) {
      memset(piVar5,0,(uVar11 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar8;
  }
  iVar12 = pNtk->nTravIds;
  pNtk->nTravIds = iVar12 + 1;
  if (0x3ffffffe < iVar12) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  pVVar6 = pNtk->vBoxes;
  if (pVVar6->nSize < 1) {
    iVar12 = 0;
  }
  else {
    lVar10 = 0;
    do {
      if ((*(uint *)&((Abc_Obj_t *)pVVar6->pArray[lVar10])->field_0x14 & 0xf) == 8) {
        Abc_ManCollectLatches_rec((Abc_Obj_t *)pVVar6->pArray[lVar10],vLatches);
        pVVar6 = pNtk->vBoxes;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar6->nSize);
    iVar12 = vLatches->nSize;
    iVar3 = pNtk->nObjCounts[8];
  }
  if (iVar12 != iVar3) {
    __assert_fail("Vec_PtrSize(vLatches) == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                  ,0x15b,"Vec_Ptr_t *Abc_ManCollectLatches(Abc_Ntk_t *)");
  }
  iVar3 = Abc_NtkRetimeForPeriod(pNtk,vNodes,vLatches,Fi,nIterLimit,fVerbose);
  if (iVar3 == 0) {
    if (vLatches->pArray != (void **)0x0) {
      free(vLatches->pArray);
    }
    free(vLatches);
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
    }
    free(vNodes);
    puts("Abc_NtkRetimeGetLags() error: The upper bound on the clock period cannot be computed.");
    uVar11 = (ulong)pNtk->vObjs->nSize;
    lVar10 = uVar11 + 1;
    piVar5 = (int *)malloc(0x10);
    iVar12 = (int)lVar10;
    iVar3 = 0x10;
    if (0xe < uVar11) {
      iVar3 = iVar12;
    }
    *piVar5 = iVar3;
    if (iVar3 == 0) {
      piVar5[2] = 0;
      piVar5[3] = 0;
      piVar5[1] = iVar12;
    }
    else {
      pvVar7 = malloc((long)iVar3 << 2);
      *(void **)(piVar5 + 2) = pvVar7;
      piVar5[1] = iVar12;
      if (pvVar7 != (void *)0x0) {
        memset(pvVar7,0,lVar10 * 4);
LAB_004d41d4:
        free(pvVar7);
      }
    }
LAB_004d41ec:
    free(piVar5);
    iVar3 = Abc_NtkCheck(pNtk);
    if (iVar3 == 0) {
      fwrite("Abc_NtkRetimeLValue(): Network check has failed.\n",0x31,1,_stdout);
    }
    return iVar1 - pNtk->nObjCounts[8];
  }
  clock_gettime(3,&local_40);
  if ((int)Fi < 1) {
LAB_004d3f3c:
    __assert_fail("FiMin < FiMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                  ,0xaf,
                  "int Abc_NtkRetimeSearch_rec(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int, int, int)"
                 );
  }
  uVar9 = 0;
LAB_004d3ef1:
  if (uVar9 + 1 != Fi) goto code_r0x004d3ef9;
  clock_gettime(3,&local_40);
  iVar3 = Abc_NtkRetimeForPeriod(pNtk,vNodes,vLatches,Fi,nIterLimit,fVerbose);
  if (iVar3 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retLvalue.c"
                  ,0x79,"Vec_Int_t *Abc_NtkRetimeGetLags(Abc_Ntk_t *, int, int)");
  }
  pVVar6 = pNtk->vObjs;
  uVar9 = pVVar6->nSize;
  if (0 < (int)uVar9) {
    lVar10 = 0;
    do {
      pvVar7 = pVVar6->pArray[lVar10];
      if (((pvVar7 != (void *)0x0) && ((*(uint *)((long)pvVar7 + 0x14) & 0xf) == 7)) &&
         (*(int *)((long)pvVar7 + 0x40) < -500000000)) {
        *(undefined8 *)((long)pvVar7 + 0x40) = 0;
        pVVar6 = pNtk->vObjs;
      }
      lVar10 = lVar10 + 1;
      uVar9 = pVVar6->nSize;
    } while (lVar10 < (int)uVar9);
  }
  iVar12 = uVar9 + 1;
  piVar5 = (int *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < uVar9) {
    iVar3 = iVar12;
  }
  *piVar5 = iVar3;
  if (iVar3 == 0) {
    piVar5[2] = 0;
    piVar5[3] = 0;
    piVar5[1] = iVar12;
LAB_004d4107:
    pvVar7 = (void *)0x0;
    uVar13 = uVar9;
  }
  else {
    pvVar7 = malloc((long)iVar3 << 2);
    *(void **)(piVar5 + 2) = pvVar7;
    piVar5[1] = iVar12;
    if (pvVar7 == (void *)0x0) goto LAB_004d4107;
    memset(pvVar7,0,(long)iVar12 << 2);
    uVar13 = pVVar6->nSize;
  }
  if (0 < (int)uVar13) {
    ppvVar4 = pVVar6->pArray;
    lVar10 = 0;
    do {
      pvVar2 = ppvVar4[lVar10];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
        iVar3 = *(int *)((long)pvVar2 + 0x10);
        if (((long)iVar3 < 0) || ((int)uVar9 < iVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(int *)((long)pvVar7 + (long)iVar3 * 4) =
             (int)(char)((char)((int)(Fi * 0x10000 + *(int *)((long)pvVar2 + 0x40)) / (int)Fi) -
                        (*(int *)((long)pvVar2 + 0x40) % (int)Fi == 0));
        uVar13 = pVVar6->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < (int)uVar13);
  }
  printf("The best clock period is %3d. (Currently, network is not modified.)\n",(ulong)Fi);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (vLatches->pArray != (void **)0x0) {
    free(vLatches->pArray);
  }
  free(vLatches);
  if (pvVar7 == (void *)0x0) goto LAB_004d41ec;
  goto LAB_004d41d4;
code_r0x004d3ef9:
  uVar13 = (int)(Fi - uVar9) / 2 + uVar9;
  iVar3 = Abc_NtkRetimeForPeriod(pNtk,vNodes,vLatches,uVar13,nIterLimit,fVerbose);
  if (iVar3 != 0) {
    Fi = uVar13;
    uVar13 = uVar9;
  }
  uVar9 = uVar13;
  if ((int)Fi <= (int)uVar9) goto LAB_004d3f3c;
  goto LAB_004d3ef1;
}

Assistant:

int Abc_NtkRetimeLValue( Abc_Ntk_t * pNtk, int nIterLimit, int fVerbose )
{
    Vec_Int_t * vLags;
    int nLatches = Abc_NtkLatchNum(pNtk);
    assert( Abc_NtkIsLogic( pNtk ) );
    // get the lags
    vLags = Abc_NtkRetimeGetLags( pNtk, nIterLimit, fVerbose );
    // compute the retiming
//    Abc_NtkRetimeUsingLags( pNtk, vLags, fVerbose );
    Vec_IntFree( vLags );
    // fix the COs
//    Abc_NtkLogicMakeSimpleCos( pNtk, 0 );
    // check for correctness
    if ( !Abc_NtkCheck( pNtk ) )
        fprintf( stdout, "Abc_NtkRetimeLValue(): Network check has failed.\n" );
    // return the number of latches saved
    return nLatches - Abc_NtkLatchNum(pNtk);
}